

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall QScroller::~QScroller(QScroller *this)

{
  QScrollerPrivate *pQVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_> *this_00;
  Type *c;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *this_01;
  long in_FS_OFFSET;
  QScroller *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007ef930;
  pQVar1 = this->d_ptr;
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *)
            (ulong)pQVar1->recognizerType;
  QGestureRecognizer::unregisterRecognizer(pQVar1->recognizerType);
  pQVar1->recognizer = (QFlickGestureRecognizer *)0x0;
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
             *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
               ::operator()(this_01);
  QMap<QObject_*,_QScroller_*>::remove
            ((QMap<QObject_*,_QScroller_*> *)this_00,(char *)&pQVar1->target);
  c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
      operator()(this_00);
  local_20 = this;
  QtPrivate::sequential_erase_one<QList<QScroller*>,QScroller*>(c,&local_20);
  if (this->d_ptr != (QScrollerPrivate *)0x0) {
    (**(code **)(*(long *)this->d_ptr + 0x20))();
  }
  QObject::~QObject(&this->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QScroller::~QScroller()
{
    Q_D(QScroller);
#ifndef QT_NO_GESTURES
    QGestureRecognizer::unregisterRecognizer(d->recognizerType);
    // do not delete the recognizer. The QGestureManager is doing this.
    d->recognizer = nullptr;
#endif
    qt_allScrollers()->remove(d->target);
    qt_activeScrollers()->removeOne(this);

    delete d_ptr;
}